

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementGeneric.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementGeneric::EleIntLoadResidual_F
          (ChElementGeneric *this,ChVectorDynamic<> *R,double c)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  char cVar3;
  int iVar4;
  uint uVar5;
  Index size;
  Index index;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined8 in_XMM0_Qb;
  ChVectorDynamic<> mFi;
  int local_70;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_68;
  long *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_48 = c;
  uStack_40 = in_XMM0_Qb;
  iVar4 = (*(this->super_ChElementBase)._vptr_ChElementBase[3])();
  local_68.m_storage.m_data = (double *)0x0;
  local_68.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_68,(long)iVar4);
  (*(this->super_ChElementBase)._vptr_ChElementBase[10])(this);
  auVar2._8_8_ = uStack_40;
  auVar2._0_8_ = local_48;
  if (local_68.m_storage.m_rows < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  uVar6 = local_68.m_storage.m_rows & 0x7ffffffffffffff8;
  if (7 < local_68.m_storage.m_rows) {
    auVar10 = vbroadcastsd_avx512f(auVar2);
    uVar8 = 0;
    do {
      auVar11 = vmulpd_avx512f(auVar10,*(undefined1 (*) [64])(local_68.m_storage.m_data + uVar8));
      *(undefined1 (*) [64])(local_68.m_storage.m_data + uVar8) = auVar11;
      uVar8 = uVar8 + 8;
    } while (uVar8 < uVar6);
  }
  if ((long)uVar6 < local_68.m_storage.m_rows) {
    do {
      local_68.m_storage.m_data[uVar6] = local_48 * local_68.m_storage.m_data[uVar6];
      uVar6 = uVar6 + 1;
    } while (local_68.m_storage.m_rows != uVar6);
  }
  local_70 = 0;
  uVar7 = 0;
  do {
    iVar4 = (*(this->super_ChElementBase)._vptr_ChElementBase[2])(this);
    if (iVar4 <= (int)uVar7) {
      if (local_68.m_storage.m_data != (double *)0x0) {
        free((void *)local_68.m_storage.m_data[-1]);
      }
      return;
    }
    uVar5 = (*(this->super_ChElementBase)._vptr_ChElementBase[4])(this,(ulong)uVar7);
    (*(this->super_ChElementBase)._vptr_ChElementBase[5])(&local_58,this,(ulong)uVar7);
    cVar3 = (**(code **)(*local_58 + 0x18))();
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
    if (0 < (int)uVar5 && cVar3 == '\0') {
      lVar9 = (long)local_70;
      uVar6 = (ulong)uVar5;
      iVar4 = 0;
      do {
        if ((local_70 < 0) || (local_68.m_storage.m_rows <= lVar9)) {
LAB_006aa0e5:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        local_48 = local_68.m_storage.m_data[lVar9];
        (*(this->super_ChElementBase)._vptr_ChElementBase[5])(&local_58,this,(ulong)uVar7);
        uVar8 = (ulong)(uint)(*(int *)((long)local_58 + *(long *)(*local_58 + -0x18) + 0xc) + iVar4)
        ;
        if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)uVar8) goto LAB_006aa0e5;
        pdVar1 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        pdVar1[uVar8] = local_48 + pdVar1[uVar8];
        if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
        }
        iVar4 = iVar4 + 1;
        lVar9 = lVar9 + 1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    local_70 = local_70 + uVar5;
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void ChElementGeneric::EleIntLoadResidual_F(ChVectorDynamic<>& R, const double c) {
    ChVectorDynamic<> mFi(this->GetNdofs());
    this->ComputeInternalForces(mFi);
    // GetLog() << "EleIntLoadResidual_F , mFi=" << mFi << "  c=" << c << "\n";
    mFi *= c;

    //// RADU
    //// Attention: this is called from within a parallel OMP for loop.
    //// Must use atomic increment when updating the global vector R.

    int stride = 0;
    for (int in = 0; in < this->GetNnodes(); in++) {
        int nodedofs = GetNodeNdofs(in);
        // GetLog() << "  in=" << in << "  stride=" << stride << "  nodedofs=" << nodedofs << " offset=" <<
        // GetNodeN(in)->NodeGetOffset_w() << "\n";
        if (!GetNodeN(in)->GetFixed()) {
            for (int j = 0; j < nodedofs; j++)
#pragma omp atomic
                R(GetNodeN(in)->NodeGetOffset_w() + j) += mFi(stride + j);
        }
        stride += nodedofs;
    }
    // GetLog() << "EleIntLoadResidual_F , R=" << R << "\n";
}